

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
     WriteDeltaFor(char *values,bool *validity,bitpacking_width_t width,char frame_of_reference,
                  char delta_offset,char *original_values,idx_t count,void *data_ptr)

{
  BitpackingCompressionState<signed_char,_true,_signed_char> *state_00;
  char in_CL;
  char in_DL;
  undefined8 in_RDI;
  char in_R8B;
  BitpackingCompressionState<signed_char,_true,_signed_char> *in_R9;
  idx_t unaff_retaddr;
  idx_t bp_size;
  BitpackingCompressionState<signed_char,_true,_signed_char> *state;
  undefined7 in_stack_ffffffffffffffc8;
  bitpacking_width_t in_stack_ffffffffffffffcf;
  idx_t in_stack_ffffffffffffffd0;
  BitpackingCompressionState<signed_char,_true,_signed_char> *pBVar1;
  bitpacking_width_t width_00;
  
  width_00 = (bitpacking_width_t)((ulong)in_RDI >> 0x38);
  pBVar1 = state;
  state_00 = (BitpackingCompressionState<signed_char,_true,_signed_char> *)
             BitpackingPrimitives::GetRequiredSize
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  ReserveSpace(state_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  WriteMetaData(in_R9,(BitpackingMode)((ulong)pBVar1 >> 0x38));
  WriteData<signed_char>(&pBVar1->data_ptr,in_CL);
  WriteData<signed_char>(&pBVar1->data_ptr,in_DL);
  WriteData<signed_char>(&pBVar1->data_ptr,in_R8B);
  BitpackingPrimitives::PackBuffer<signed_char,false>
            ((data_ptr_t)state,(char *)bp_size,unaff_retaddr,width_00);
  pBVar1->data_ptr = pBVar1->data_ptr + (long)(&state_00->state + -1) + 0x17e8;
  UpdateStats(state_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}